

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

bool Diligent::ValidateBufferMode<Diligent::BufferViewVkImpl>
               (PipelineResourceDesc *ResDesc,Uint32 ArrayIndex,BufferViewVkImpl *pBufferView)

{
  int iVar1;
  undefined4 extraout_var;
  Uint32 in_R8D;
  bool bVar2;
  string msg;
  String local_48;
  char (*Args_2) [14];
  
  bVar2 = true;
  if (pBufferView != (BufferViewVkImpl *)0x0) {
    iVar1 = (*(((pBufferView->super_BufferViewBase<Diligent::EngineVkImplTraits>).m_pBuffer)->
              super_IDeviceObject).super_IObject._vptr_IObject[4])();
    Args_2 = (char (*) [14])CONCAT44(extraout_var,iVar1);
    if ((ResDesc->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == PIPELINE_RESOURCE_FLAG_NONE) {
      if ((Args_2[1][8] & 0xfeU) == 2) {
        return true;
      }
      GetShaderResourcePrintName_abi_cxx11_
                (&local_48,(Diligent *)ResDesc->Name,(char *)(ulong)ResDesc->ArraySize,ArrayIndex,
                 in_R8D);
      FormatString<char[28],char_const*,char[14],char_const*,char[23],std::__cxx11::string,char[46]>
                (&msg,(Diligent *)"Error binding buffer view \'",
                 (char (*) [28])
                 &(pBufferView->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                  .m_Desc,(char **)"\' of buffer \'",Args_2,(char **)"\' to shader variable \'",
                 (char (*) [23])&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\': structured or raw buffer view is expected.",
                 (char (*) [46])msg._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidateBufferMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x1eb);
    }
    else {
      if (Args_2[1][8] == 1) {
        return true;
      }
      GetShaderResourcePrintName_abi_cxx11_
                (&local_48,(Diligent *)ResDesc->Name,(char *)(ulong)ResDesc->ArraySize,ArrayIndex,
                 in_R8D);
      FormatString<char[28],char_const*,char[14],char_const*,char[23],std::__cxx11::string,char[38]>
                (&msg,(Diligent *)"Error binding buffer view \'",
                 (char (*) [28])
                 &(pBufferView->super_BufferViewBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                  .m_Desc,(char **)"\' of buffer \'",Args_2,(char **)"\' to shader variable \'",
                 (char (*) [23])&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\': formatted buffer view is expected.",(char (*) [38])msg._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidateBufferMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x1e1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ValidateBufferMode(const PipelineResourceDesc& ResDesc,
                        Uint32                      ArrayIndex,
                        const BufferViewImplType*   pBufferView)
{
    bool BindingOK = true;
    if (pBufferView != nullptr)
    {
        const BufferDesc& BuffDesc = pBufferView->GetBuffer()->GetDesc();
        if (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER)
        {
            if (BuffDesc.Mode != BUFFER_MODE_FORMATTED)
            {
                RESOURCE_VALIDATION_FAILURE("Error binding buffer view '", pBufferView->GetDesc().Name, "' of buffer '", BuffDesc.Name, "' to shader variable '",
                                            GetShaderResourcePrintName(ResDesc, ArrayIndex), "': formatted buffer view is expected.");

                BindingOK = false;
            }
        }
        else
        {
            if (BuffDesc.Mode != BUFFER_MODE_STRUCTURED && BuffDesc.Mode != BUFFER_MODE_RAW)
            {
                RESOURCE_VALIDATION_FAILURE("Error binding buffer view '", pBufferView->GetDesc().Name, "' of buffer '", BuffDesc.Name, "' to shader variable '",
                                            GetShaderResourcePrintName(ResDesc, ArrayIndex), "': structured or raw buffer view is expected.");

                BindingOK = false;
            }
        }
    }

    return BindingOK;
}